

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

int __thiscall MovDemuxer::mov_read_stss(MovDemuxer *this,MOVAtom atom)

{
  Track *pTVar1;
  iterator __position;
  uint uVar2;
  ulong uVar3;
  uint local_2c;
  
  pTVar1 = (this->super_IOContextDemuxer).tracks
           [(long)(this->super_IOContextDemuxer).num_tracks + -1];
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  if (*(int *)((long)&pTVar1[1].encodingAlgoPriv.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8) == 0) {
    if (0x3ffffffe < uVar2) {
      return -1;
    }
    if (uVar2 != 0) {
      uVar3 = (ulong)uVar2;
      do {
        local_2c = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
        __position._M_current = (uint *)pTVar1[2].codec_id;
        if (__position._M_current == (uint *)pTVar1[2].codec_name) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar1[2].language,
                     __position,&local_2c);
        }
        else {
          *__position._M_current = local_2c;
          pTVar1[2].codec_id = (char *)(__position._M_current + 1);
        }
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return 0;
}

Assistant:

int MovDemuxer::mov_read_stss(MOVAtom atom)
{
    const auto st = reinterpret_cast<MOVStreamContext*>(tracks[num_tracks - 1]);
    get_byte();  // version
    get_be24();  // flags

    const unsigned int entries = get_be32();
    if (st->sample_size)
        return 0;
    if (entries >= UINT_MAX / sizeof(int))
        return -1;
    for (size_t i = 0; i < entries; i++) st->keyframes.push_back(get_be32());
    return 0;
}